

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall
sglr::ReferenceContext::deleteRenderbuffer(ReferenceContext *this,Renderbuffer *renderbuffer)

{
  Attachment *attachment;
  Framebuffer *pFVar1;
  Framebuffer *pFVar2;
  bool bVar3;
  bool bVar4;
  int point;
  long lVar5;
  Framebuffer *pFVar6;
  int iVar7;
  
  if (this->m_renderbufferBinding == renderbuffer) {
    (*(this->super_Context)._vptr_Context[0xc])(this,0x8d41,0);
  }
  bVar4 = true;
  do {
    bVar3 = bVar4;
    pFVar1 = this->m_readFramebufferBinding;
    pFVar2 = this->m_drawFramebufferBinding;
    pFVar6 = pFVar2;
    if (bVar3) {
      pFVar6 = pFVar1;
    }
    if (pFVar6 != (Framebuffer *)0x0) {
      lVar5 = 0;
      do {
        if (pFVar6->m_attachments[lVar5].name == (renderbuffer->super_NamedObject).m_name) {
          attachment = pFVar6->m_attachments + lVar5;
          for (iVar7 = (uint)(pFVar6 == pFVar1) + (uint)(pFVar6 == pFVar2); iVar7 != 0;
              iVar7 = iVar7 + -1) {
            releaseFboAttachmentReference(this,attachment);
          }
          attachment->type = ATTACHMENTTYPE_LAST;
          attachment->name = 0;
          attachment->texTarget = TEXTARGET_LAST;
          attachment->level = 0;
          attachment->layer = 0;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
    }
    bVar4 = false;
  } while (bVar3);
  rc::ObjectManager<sglr::rc::Renderbuffer>::releaseReference(&this->m_renderbuffers,renderbuffer);
  return;
}

Assistant:

void ReferenceContext::deleteRenderbuffer (Renderbuffer* renderbuffer)
{
	if (m_renderbufferBinding == renderbuffer)
		bindRenderbuffer(GL_RENDERBUFFER, 0);

	// Unbind from currently bound framebuffers
	for (int ndx = 0; ndx < 2; ndx++)
	{
		rc::Framebuffer* framebufferBinding = ndx ? m_drawFramebufferBinding : m_readFramebufferBinding;
		if (framebufferBinding)
		{
			int releaseRefCount = (framebufferBinding == m_drawFramebufferBinding ? 1 : 0)
								+ (framebufferBinding == m_readFramebufferBinding ? 1 : 0);

			for (int point = 0; point < Framebuffer::ATTACHMENTPOINT_LAST; point++)
			{
				Framebuffer::Attachment& attachment = framebufferBinding->getAttachment((Framebuffer::AttachmentPoint)point);
				if (attachment.name == renderbuffer->getName())
				{
					for (int refNdx = 0; refNdx < releaseRefCount; refNdx++)
						releaseFboAttachmentReference(attachment);
					attachment = Framebuffer::Attachment();
				}
			}
		}
	}

	DE_ASSERT(renderbuffer->getRefCount() == 1);
	m_renderbuffers.releaseReference(renderbuffer);
}